

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_sequence.cpp
# Opt level: O3

void append_values_from_sequence(ConcurrentData *data)

{
  mutex *__mutex;
  iterator __position;
  int iVar1;
  pointer pMVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  int64_t res;
  Connection con;
  long local_a8;
  long *local_a0;
  vector<long,std::allocator<long>> *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [48];
  Connection local_50 [32];
  
  duckdb::Connection::Connection(local_50,data->db);
  __mutex = &data->lock;
  local_98 = (vector<long,std::allocator<long>> *)&data->results;
  lVar5 = 100;
  do {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SELECT nextval(\'seq\')","")
    ;
    duckdb::Connection::Query((string *)&local_a0);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    pMVar2 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)&local_a0);
    duckdb::MaterializedQueryResult::GetValue((ulong)local_90,(ulong)pMVar2);
    lVar3 = duckdb::Value::GetValue<long>();
    duckdb::Value::~Value((Value *)local_90);
    local_a8 = lVar3;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      uVar4 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (local_a0 != (long *)0x0) {
        (**(code **)(*local_a0 + 8))();
      }
      duckdb::Connection::~Connection(local_50);
      _Unwind_Resume(uVar4);
    }
    __position._M_current =
         (data->results).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->results).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                (local_98,__position,&local_a8);
    }
    else {
      *__position._M_current = local_a8;
      (data->results).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  duckdb::Connection::~Connection(local_50);
  return;
}

Assistant:

static void append_values_from_sequence(ConcurrentData *data) {
	Connection con(data->db);
	for (size_t i = 0; i < CONCURRENT_SEQUENCE_INSERT_COUNT; i++) {
		auto result = con.Query("SELECT nextval('seq')");
		int64_t res = result->GetValue(0, 0).GetValue<int64_t>();
		lock_guard<mutex> lock(data->lock);
		data->results.push_back(res);
	}
}